

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O2

RGBColorSpace * pbrt::RGBColorSpace::Lookup(Point2f r,Point2f g,Point2f b,Point2f w)

{
  RGBColorSpace *a;
  bool bVar1;
  Point2f *b_00;
  Point2f *b_01;
  Point2f *b_02;
  Point2f *extraout_RDX;
  Point2f *b_03;
  long lVar2;
  undefined1 in_XMM0 [16];
  undefined1 in_XMM1 [16];
  undefined1 in_XMM2 [16];
  undefined1 in_XMM3 [16];
  Point2f *local_70 [4];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  lVar2 = 0;
  local_38 = vmovlps_avx(in_XMM0);
  local_40 = vmovlps_avx(in_XMM1);
  local_48 = vmovlps_avx(in_XMM2);
  local_50 = vmovlps_avx(in_XMM3);
  local_70[0] = ACES2065_1;
  local_70[1] = (Point2f *)DCI_P3;
  local_70[2] = Rec2020;
  local_70[3] = (Point2f *)sRGB;
  b_03 = Rec2020;
  while( true ) {
    if (lVar2 == 0x20) {
      return (RGBColorSpace *)0x0;
    }
    a = *(RGBColorSpace **)((long)local_70 + lVar2);
    bVar1 = Lookup::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_38,&a->r,b_03);
    b_03 = b_00;
    if ((((bVar1) &&
         (bVar1 = Lookup::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)&local_40,&a->g,b_00), b_03 = b_01, bVar1))
        && (bVar1 = Lookup::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)&local_48,&a->b,b_01), b_03 = b_02, bVar1)
        ) && (bVar1 = Lookup::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)&local_50,&a->w,b_02),
             b_03 = extraout_RDX, bVar1)) break;
    lVar2 = lVar2 + 8;
  }
  return a;
}

Assistant:

const RGBColorSpace *RGBColorSpace::Lookup(Point2f r, Point2f g, Point2f b, Point2f w) {
    auto closeEnough = [](const Point2f &a, const Point2f &b) {
        return ((a.x == b.x || std::abs((a.x - b.x) / b.x) < 1e-3) &&
                (a.y == b.y || std::abs((a.y - b.y) / b.y) < 1e-3));
    };
    for (const RGBColorSpace *cs : {ACES2065_1, DCI_P3, Rec2020, sRGB}) {
        if (closeEnough(r, cs->r) && closeEnough(g, cs->g) && closeEnough(b, cs->b) &&
            closeEnough(w, cs->w))
            return cs;
    }
    return nullptr;
}